

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O3

void ut::
     are_equal<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry,1ul,std::vector<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry,std::allocator<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry>>>
               (render_log_entry (*expected) [1],
               vector<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry>_>
               *actual,LocationInfo *location)

{
  render_log_entry *rhs;
  bool bVar1;
  FailedAssertion *pFVar2;
  string local_40;
  
  rhs = (actual->
        super__Vector_base<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(actual->
            super__Vector_base<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)rhs != 0x20) {
    pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
    __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  bVar1 = agge::tests::mocks::renderer_adapter<unsigned_char>::render_log_entry::operator==
                    (*expected,rhs);
  if (bVar1) {
    return;
  }
  pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
  __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}